

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

TVector2<double> __thiscall TAngle<double>::ToVector(TAngle<double> *this,double length)

{
  TAngle<double> *in_RSI;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  TVector2<double> TVar3;
  double length_local;
  TAngle<double> *this_local;
  
  dVar1 = Cos(in_RSI);
  dVar2 = Sin(in_RSI);
  dVar2 = length * dVar2;
  TVector2<double>::TVector2((TVector2<double> *)this,length * dVar1,dVar2);
  TVar3.Y = dVar2;
  TVar3.X = extraout_XMM0_Qa;
  return TVar3;
}

Assistant:

TVector2<vec_t> ToVector(vec_t length = 1) const
	{
		return TVector2<vec_t>(length * Cos(), length * Sin());
	}